

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdLut.c
# Opt level: O3

int Sbd_ProblemAddClauses(sat_solver *pSat,int nVars,int nStrs,int *pVars,Sbd_Str_t *pStr0)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  uint uVar5;
  bool bVar6;
  Sbd_Str_t *pSVar7;
  long lVar8;
  ulong uVar9;
  int pLits [6];
  uint local_58 [6];
  Sbd_Str_t *local_40;
  sat_solver *local_38;
  
  if (0 < nStrs) {
    pSVar7 = pStr0 + nStrs;
    uVar9 = (ulong)(uint)(nStrs + nVars);
    lVar8 = (long)nVars;
    local_40 = pSVar7;
    local_38 = pSat;
    do {
      iVar3 = pStr0->nVarIns;
      if (pStr0->fLut == 0) {
        if (10 < iVar3) {
          __assert_fail("pStr->nVarIns <= SBD_DIV_MAX",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdLut.c"
                        ,0x54,
                        "int Sbd_ProblemAddClauses(sat_solver *, int, int, int *, Sbd_Str_t *)");
        }
        if (0 < iVar3) {
          uVar9 = (ulong)(int)uVar9;
          lVar4 = 0;
          do {
            iVar3 = 0;
            bVar1 = true;
            do {
              bVar6 = bVar1;
              if (pVars[uVar9] < 0) goto LAB_00547b7e;
              local_58[0] = pVars[uVar9] * 2 + 1;
              if (pVars[lVar8] < 0) goto LAB_00547b7e;
              local_58[1] = iVar3 + pVars[lVar8] * 2;
              if (pVars[pStr0->VarIns[lVar4]] < 0) goto LAB_00547b7e;
              local_58[2] = iVar3 + pVars[pStr0->VarIns[lVar4]] * 2 ^ 1;
              iVar3 = sat_solver_addclause(local_38,(lit *)local_58,(lit *)(local_58 + 3));
              if (iVar3 == 0) {
                return 0;
              }
              iVar3 = 1;
              bVar1 = false;
            } while (bVar6);
            lVar4 = lVar4 + 1;
            uVar9 = uVar9 + 1;
            pSVar7 = local_40;
          } while (lVar4 < pStr0->nVarIns);
        }
      }
      else {
        if (6 < iVar3) {
          __assert_fail("pStr->nVarIns <= 6",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdLut.c"
                        ,0x43,
                        "int Sbd_ProblemAddClauses(sat_solver *, int, int, int *, Sbd_Str_t *)");
        }
        uVar2 = 1 << ((byte)iVar3 & 0x1f);
        uVar9 = (ulong)(int)uVar9;
        if ((int)uVar2 < 2) {
          uVar2 = 1;
        }
        uVar5 = 0;
        do {
          iVar3 = pStr0->nVarIns;
          if (0 < (long)iVar3) {
            lVar4 = 0;
            do {
              if (pVars[pStr0->VarIns[lVar4]] < 0) goto LAB_00547b7e;
              local_58[lVar4] =
                   (uint)((uVar5 >> ((uint)lVar4 & 0x1f) & 1) != 0) +
                   pVars[pStr0->VarIns[lVar4]] * 2;
              lVar4 = lVar4 + 1;
            } while (iVar3 != lVar4);
          }
          iVar3 = 0;
          bVar1 = true;
          do {
            bVar6 = bVar1;
            if (pVars[uVar9] < 0) {
LAB_00547b7e:
              __assert_fail("Var >= 0 && !(c >> 1)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                            ,0x12e,"int Abc_Var2Lit(int, int)");
            }
            lVar4 = (long)pStr0->nVarIns;
            local_58[lVar4] = iVar3 + pVars[uVar9] * 2;
            if (pVars[lVar8] < 0) goto LAB_00547b7e;
            local_58[lVar4 + 1] = iVar3 + pVars[lVar8] * 2 ^ 1;
            iVar3 = sat_solver_addclause(local_38,(lit *)local_58,(lit *)(local_58 + lVar4 + 2));
            if (iVar3 == 0) {
              return 0;
            }
            iVar3 = 1;
            bVar1 = false;
          } while (bVar6);
          uVar5 = uVar5 + 1;
          uVar9 = uVar9 + 1;
          pSVar7 = local_40;
        } while (uVar5 != uVar2);
      }
      pStr0 = pStr0 + 1;
      lVar8 = lVar8 + 1;
    } while (pStr0 < pSVar7);
  }
  return 1;
}

Assistant:

int Sbd_ProblemAddClauses( sat_solver * pSat, int nVars, int nStrs, int * pVars, Sbd_Str_t * pStr0 )
{   
    // variable order:  inputs, structure outputs, parameters
    Sbd_Str_t * pStr;
    int VarOut = nVars;
    int VarPar = nVars + nStrs;
    int m, k, n, status, pLits[SBD_SIZE_MAX+2];
//printf( "Start par = %d.  ", VarPar );
    for ( pStr = pStr0; pStr < pStr0 + nStrs; pStr++, VarOut++ )
    {
        if ( pStr->fLut )
        {
            int nMints = 1 << pStr->nVarIns;
            assert( pStr->nVarIns <= 6 );
            for ( m = 0; m < nMints; m++, VarPar++ )
            {
                for ( k = 0; k < pStr->nVarIns; k++ )
                    pLits[k] = Abc_Var2Lit( pVars[pStr->VarIns[k]], (m >> k) & 1 ); 
                for ( n = 0; n < 2; n++ )
                {
                    pLits[pStr->nVarIns]   = Abc_Var2Lit( pVars[VarPar], n );
                    pLits[pStr->nVarIns+1] = Abc_Var2Lit( pVars[VarOut], !n );
                    status = sat_solver_addclause( pSat, pLits, pLits + pStr->nVarIns + 2 );
                    if ( !status )
                        return 0;
                }
            }
        }
        else
        {
            assert( pStr->nVarIns <= SBD_DIV_MAX );
            for ( k = 0; k < pStr->nVarIns; k++, VarPar++ )
            {
                for ( n = 0; n < 2; n++ )
                {
                    pLits[0] = Abc_Var2Lit( pVars[VarPar], 1 );
                    pLits[1] = Abc_Var2Lit( pVars[VarOut], n );
                    pLits[2] = Abc_Var2Lit( pVars[pStr->VarIns[k]], !n );
                    status = sat_solver_addclause( pSat, pLits, pLits + 3 );
                    if ( !status )
                        return 0;
                }
            }
        }
    }
    return 1;
}